

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_world.cc
# Opt level: O0

void sptk::world::makect(int nc,int *ip,double *c)

{
  int iVar1;
  double *in_RDX;
  long in_RSI;
  int in_EDI;
  double dVar2;
  double dVar3;
  double delta;
  int nch;
  int j;
  int local_1c;
  
  *(int *)(in_RSI + 4) = in_EDI;
  if (1 < in_EDI) {
    iVar1 = in_EDI >> 1;
    dVar2 = atan(1.0);
    dVar2 = dVar2 / (double)iVar1;
    dVar3 = cos(dVar2 * (double)iVar1);
    *in_RDX = dVar3;
    in_RDX[iVar1] = *in_RDX * 0.5;
    for (local_1c = 1; local_1c < iVar1; local_1c = local_1c + 1) {
      dVar3 = cos(dVar2 * (double)local_1c);
      in_RDX[local_1c] = dVar3 * 0.5;
      dVar3 = sin(dVar2 * (double)local_1c);
      in_RDX[in_EDI - local_1c] = dVar3 * 0.5;
    }
  }
  return;
}

Assistant:

void makect(int nc, int *ip, double *c) {
  int j, nch;
  double delta;

  ip[1] = nc;
  if (nc > 1) {
    nch = nc >> 1;
    delta = atan(1.0) / nch;
    c[0] = cos(delta * nch);
    c[nch] = 0.5 * c[0];
    for (j = 1; j < nch; j++) {
      c[j] = 0.5 * cos(delta * j);
      c[nc - j] = 0.5 * sin(delta * j);
    }
  }
}